

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O2

bool __thiscall
testing::internal::
ElementsAreMatcherImpl<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
::MatchAndExplain(ElementsAreMatcherImpl<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
                  *this,set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>
                        *container,MatchResultListener *listener)

{
  ostream *poVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pbVar3;
  bool bVar4;
  _Base_ptr p_Var5;
  MatchResultListener *pMVar6;
  pointer pMVar7;
  pointer pMVar8;
  _func_int **pp_Var9;
  bool bVar10;
  size_t count;
  size_t local_218;
  ElementsAreMatcherImpl<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
  *local_210;
  _Rb_tree_node_base *local_208;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  explanations;
  string local_1e8 [32];
  StringMatchResultListener s;
  
  poVar1 = listener->stream_;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&explanations,
           ((long)(this->matchers_).
                  super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->matchers_).
                 super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x18,(allocator_type *)&s);
  p_Var5 = (container->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_208 = &(container->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_210 = this;
  for (count = 0;
      (local_218 = count, p_Var5 != local_208 &&
      (pMVar7 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start,
      count != ((long)(this->matchers_).
                      super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar7) / 0x18));
      count = count + 1) {
    if (poVar1 == (ostream *)0x0) {
      bVar4 = MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::
              Matches(&pMVar7[count].
                       super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>
                      ,(not_null<const_pstore::command_line::option_*> *)(p_Var5 + 1));
      count = local_218;
      if (!bVar4) {
        bVar4 = true;
        p_Var2 = local_208;
        goto LAB_00130ff6;
      }
    }
    else {
      StringMatchResultListener::StringMatchResultListener(&s);
      bVar4 = MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>::
              MatchAndExplain(&(this->matchers_).
                               super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[count].
                               super_MatcherBase<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>
                              ,(not_null<const_pstore::command_line::option_*> *)(p_Var5 + 1),
                              &s.super_MatchResultListener);
      std::__cxx11::stringbuf::str();
      count = local_218;
      std::__cxx11::string::operator=
                ((string *)
                 (explanations.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + local_218),local_1e8);
      std::__cxx11::string::~string(local_1e8);
      StringMatchResultListener::~StringMatchResultListener(&s);
      this = local_210;
      if (!bVar4) {
        bVar4 = true;
        p_Var2 = local_208;
        goto LAB_00130ff6;
      }
    }
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
  }
  bVar4 = false;
  p_Var2 = local_208;
LAB_00130ff6:
  while (p_Var5 != p_Var2) {
    p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    count = count + 1;
  }
  pMVar7 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pMVar8 = (this->matchers_).
           super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (((long)pMVar8 - (long)pMVar7) / 0x18 == count) {
    if (!bVar4) {
      bVar4 = true;
      if (poVar1 != (ostream *)0x0) {
        bVar10 = false;
        pp_Var9 = (_func_int **)0x0;
        while (pbVar3 = explanations.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
              s.super_MatchResultListener._vptr_MatchResultListener = pp_Var9,
              pp_Var9 != (_func_int **)(((long)pMVar8 - (long)pMVar7) / 0x18)) {
          if (explanations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[(long)pp_Var9]._M_string_length != 0) {
            if (bVar10) {
              MatchResultListener::operator<<(listener,(char (*) [7])",\nand ");
            }
            pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
            pMVar6 = MatchResultListener::operator<<(pMVar6,(unsigned_long *)&s);
            pMVar6 = MatchResultListener::operator<<(pMVar6,(char (*) [11])" matches, ");
            MatchResultListener::operator<<(pMVar6,pbVar3 + (long)pp_Var9);
            pMVar7 = (local_210->matchers_).
                     super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            pMVar8 = (local_210->matchers_).
                     super__Vector_base<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>,_std::allocator<testing::Matcher<const_pstore::gsl::not_null<const_pstore::command_line::option_*>_&>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            bVar10 = true;
          }
          pp_Var9 = (_func_int **)((long)s.super_MatchResultListener._vptr_MatchResultListener + 1);
        }
      }
      goto LAB_001310d1;
    }
    if (poVar1 != (ostream *)0x0) {
      pMVar6 = MatchResultListener::operator<<(listener,(char (*) [16])"whose element #");
      pMVar6 = MatchResultListener::operator<<(pMVar6,&local_218);
      MatchResultListener::operator<<(pMVar6,(char (*) [15])" doesn\'t match");
      PrintIfNotEmpty(explanations.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start + local_218,listener->stream_);
    }
  }
  else {
    bVar4 = false;
    if ((poVar1 == (ostream *)0x0) || (count == 0)) goto LAB_001310d1;
    pMVar6 = MatchResultListener::operator<<(listener,(char (*) [11])"which has ");
    Elements((ElementsAreMatcherImpl<const_std::set<pstore::gsl::not_null<const_pstore::command_line::option_*>,_pstore::command_line::details::less_name,_std::allocator<pstore::gsl::not_null<const_pstore::command_line::option_*>_>_>_&>
              *)&s,count);
    MatchResultListener::operator<<(pMVar6,(Message *)&s);
    if (s.super_MatchResultListener._vptr_MatchResultListener != (_func_int **)0x0) {
      (**(code **)(*s.super_MatchResultListener._vptr_MatchResultListener + 8))();
    }
  }
  bVar4 = false;
LAB_001310d1:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&explanations);
  return bVar4;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    // To work with stream-like "containers", we must only walk
    // through the elements in one pass.

    const bool listener_interested = listener->IsInterested();

    // explanations[i] is the explanation of the element at index i.
    ::std::vector<std::string> explanations(count());
    StlContainerReference stl_container = View::ConstReference(container);
    typename StlContainer::const_iterator it = stl_container.begin();
    size_t exam_pos = 0;
    bool mismatch_found = false;  // Have we found a mismatched element yet?

    // Go through the elements and matchers in pairs, until we reach
    // the end of either the elements or the matchers, or until we find a
    // mismatch.
    for (; it != stl_container.end() && exam_pos != count(); ++it, ++exam_pos) {
      bool match;  // Does the current element match the current matcher?
      if (listener_interested) {
        StringMatchResultListener s;
        match = matchers_[exam_pos].MatchAndExplain(*it, &s);
        explanations[exam_pos] = s.str();
      } else {
        match = matchers_[exam_pos].Matches(*it);
      }

      if (!match) {
        mismatch_found = true;
        break;
      }
    }
    // If mismatch_found is true, 'exam_pos' is the index of the mismatch.

    // Find how many elements the actual container has.  We avoid
    // calling size() s.t. this code works for stream-like "containers"
    // that don't define size().
    size_t actual_count = exam_pos;
    for (; it != stl_container.end(); ++it) {
      ++actual_count;
    }

    if (actual_count != count()) {
      // The element count doesn't match.  If the container is empty,
      // there's no need to explain anything as Google Mock already
      // prints the empty container.  Otherwise we just need to show
      // how many elements there actually are.
      if (listener_interested && (actual_count != 0)) {
        *listener << "which has " << Elements(actual_count);
      }
      return false;
    }

    if (mismatch_found) {
      // The element count matches, but the exam_pos-th element doesn't match.
      if (listener_interested) {
        *listener << "whose element #" << exam_pos << " doesn't match";
        PrintIfNotEmpty(explanations[exam_pos], listener->stream());
      }
      return false;
    }

    // Every element matches its expectation.  We need to explain why
    // (the obvious ones can be skipped).
    if (listener_interested) {
      bool reason_printed = false;
      for (size_t i = 0; i != count(); ++i) {
        const std::string& s = explanations[i];
        if (!s.empty()) {
          if (reason_printed) {
            *listener << ",\nand ";
          }
          *listener << "whose element #" << i << " matches, " << s;
          reason_printed = true;
        }
      }
    }
    return true;
  }